

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O1

void __thiscall
tinyxml2::XMLDocument::XMLDocument(XMLDocument *this,bool processEntities,Whitespace whitespace)

{
  (this->super_XMLNode)._value._start = (char *)0x0;
  (this->super_XMLNode)._value._end = (char *)0x0;
  (this->super_XMLNode)._firstChild = (XMLNode *)0x0;
  (this->super_XMLNode)._lastChild = (XMLNode *)0x0;
  (this->super_XMLNode)._prev = (XMLNode *)0x0;
  (this->super_XMLNode)._next = (XMLNode *)0x0;
  (this->super_XMLNode)._memPool = (MemPool *)0x0;
  (this->super_XMLNode)._document = (XMLDocument *)0x0;
  (this->super_XMLNode)._parent = (XMLNode *)0x0;
  (this->super_XMLNode)._value._flags = 0;
  (this->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_00267860;
  this->_writeBOM = false;
  this->_processEntities = processEntities;
  this->_errorID = XML_NO_ERROR;
  this->_whitespace = whitespace;
  this->_errorStr1 = (char *)0x0;
  this->_errorStr2 = (char *)0x0;
  this->_charBuffer = (char *)0x0;
  (this->_elementPool).super_MemPool._vptr_MemPool = (_func_int **)&PTR__MemPoolT_00267b10;
  (this->_elementPool)._blockPtrs._mem = (this->_elementPool)._blockPtrs._pool;
  (this->_elementPool)._blockPtrs._allocated = 10;
  (this->_elementPool)._currentAllocs = 0;
  (this->_elementPool)._nAllocs = 0;
  (this->_elementPool)._maxAllocs = 0;
  (this->_elementPool)._nUntracked = 0;
  *(undefined8 *)&(this->_elementPool)._blockPtrs._size = 0;
  *(undefined8 *)((long)&(this->_elementPool)._root + 4) = 0;
  (this->_attributePool).super_MemPool._vptr_MemPool = (_func_int **)&PTR__MemPoolT_00267b80;
  (this->_attributePool)._blockPtrs._mem = (this->_attributePool)._blockPtrs._pool;
  (this->_attributePool)._blockPtrs._allocated = 10;
  *(undefined8 *)&(this->_attributePool)._blockPtrs._size = 0;
  *(undefined8 *)((long)&(this->_attributePool)._root + 4) = 0;
  (this->_attributePool)._currentAllocs = 0;
  (this->_attributePool)._nAllocs = 0;
  (this->_attributePool)._maxAllocs = 0;
  (this->_attributePool)._nUntracked = 0;
  (this->_textPool).super_MemPool._vptr_MemPool = (_func_int **)&PTR__MemPoolT_00267be0;
  (this->_textPool)._blockPtrs._mem = (this->_textPool)._blockPtrs._pool;
  (this->_textPool)._blockPtrs._allocated = 10;
  *(undefined8 *)&(this->_textPool)._blockPtrs._size = 0;
  *(undefined8 *)((long)&(this->_textPool)._root + 4) = 0;
  (this->_textPool)._currentAllocs = 0;
  (this->_textPool)._nAllocs = 0;
  (this->_textPool)._maxAllocs = 0;
  (this->_textPool)._nUntracked = 0;
  (this->_commentPool).super_MemPool._vptr_MemPool = (_func_int **)&PTR__MemPoolT_00267c40;
  (this->_commentPool)._blockPtrs._mem = (this->_commentPool)._blockPtrs._pool;
  (this->_commentPool)._blockPtrs._allocated = 10;
  *(undefined8 *)&(this->_commentPool)._blockPtrs._size = 0;
  *(undefined8 *)((long)&(this->_commentPool)._root + 4) = 0;
  (this->_commentPool)._currentAllocs = 0;
  (this->_commentPool)._nAllocs = 0;
  (this->_commentPool)._maxAllocs = 0;
  (this->_commentPool)._nUntracked = 0;
  (this->super_XMLNode)._document = this;
  return;
}

Assistant:

StrPair() : _flags( 0 ), _start( 0 ), _end( 0 ) {}